

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O3

tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
* packing::overloadAndRemove
            (tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
             *__return_storage_ptr__,
            vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes)

{
  _Bit_type *p_Var1;
  _Elt_pointer pPVar2;
  unsigned_long uVar3;
  const_iterator __position;
  FILE *pFVar4;
  _Optional_payload_base<packing::ProtoPalAttrs> *p_Var5;
  pointer poVar6;
  pointer puVar7;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *ptVar8;
  const_iterator cVar9;
  AssignedProtos *pAVar10;
  bool bVar11;
  bool bVar12;
  size_t sVar13;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  *puVar14;
  ushort *puVar15;
  const_iterator pvVar16;
  __normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var17;
  _Hash_node_base *p_Var18;
  const_iterator pvVar19;
  size_type sVar20;
  AssignedProtos *pAVar21;
  unsigned_long uVar22;
  uint uVar23;
  ulong uVar24;
  const_iterator pvVar25;
  AssignedProtos *pal;
  ProtoPalette *pPVar26;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var27;
  pointer pAVar28;
  _Optional_payload_base<packing::ProtoPalAttrs> *p_Var29;
  pointer puVar30;
  AssignedProtos *__range3_1;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var31;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var32;
  _Optional_payload_base<packing::ProtoPalAttrs> *p_Var33;
  pointer poVar34;
  _Elt_pointer pPVar35;
  ulong uVar36;
  pointer poVar37;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var38;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *in_R9;
  _Optional_payload_base<packing::ProtoPalAttrs> *p_Var39;
  long lVar40;
  value_type_conflict2 *colorIndex;
  _Optional_payload_base<packing::ProtoPalAttrs> *p_Var41;
  pointer pAVar42;
  AssignedProtos *pAVar43;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var44;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  *pIVar45;
  long lVar46;
  AssignedProtos *pAVar47;
  pointer poVar48;
  double dVar49;
  undefined1 auVar50 [16];
  double dVar52;
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  iter;
  _Bit_iterator _Var54;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_00;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_01;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_02;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_03;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_04;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_05;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_06;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_00;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_01;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_02;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_03;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_04;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_05;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_06;
  ProtoPalAttrs *attrs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> members;
  DefaultInitVec<size_t> mappings;
  anon_class_8_1_7660daf7 efficiency;
  DefaultInitVec<size_t> sortedProtoPalIDs;
  queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
  queue;
  vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> local_198;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  *local_180;
  AssignedProtos *local_178;
  double dStack_170;
  AssignedProtos *local_160;
  _Node_iterator_base<unsigned_short,_false> local_158;
  AssignedProtos *local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  AssignedProtos *local_130;
  undefined1 local_128 [56];
  _Elt_pointer pPStack_f0;
  _Elt_pointer local_e8;
  _Map_pointer ppPStack_e0;
  undefined1 local_d0 [40];
  vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a8;
  _Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> local_90;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *local_40;
  _Node_iterator_base<unsigned_short,_false> local_38;
  
  local_40 = __return_storage_ptr__;
  Options::verbosePrint
            (&options,'\x02',"Paginating palettes using \"overload-and-remove\" strategy...\n");
  local_180 = (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
               *)protoPalettes;
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector(&local_a8,
           (long)(protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_90);
  if (local_a8.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_a8.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_a8.
    super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_a8.
         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_90._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  if ((local_180->_iter)._M_current !=
      (optional<packing::ProtoPalAttrs> *)
      (((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)&local_180->_array)->_M_impl).
      super__Vector_impl_data._M_start) {
    do {
      uVar36 = (long)local_a8.
                     super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.
                     super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      cVar9._M_current =
           local_a8.
           super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      while (__position._M_current = cVar9._M_current, 0 < (long)uVar36) {
        uVar24 = uVar36 >> 1;
        uVar36 = ~uVar24 + uVar36;
        cVar9._M_current = __position._M_current + uVar24 + 1;
        if (local_90._M_impl.super__Deque_impl_data._M_map <=
            (_Map_pointer)__position._M_current[uVar24]) {
          uVar36 = uVar24;
          cVar9._M_current = __position._M_current;
        }
      }
      std::
      vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::insert(&local_a8,__position,(value_type_conflict3 *)&local_90);
      local_90._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)((long)local_90._M_impl.super__Deque_impl_data._M_map + 1);
    } while (local_90._M_impl.super__Deque_impl_data._M_map <
             (_Map_pointer)
             ((long)(local_180->_iter)._M_current -
              (long)(((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                     &local_180->_array)->_M_impl).super__Vector_impl_data._M_start >> 3));
  }
  local_e8 = (_Elt_pointer)0x0;
  ppPStack_e0 = (_Map_pointer)0x0;
  local_128._48_8_ = (_Elt_pointer)0x0;
  pPStack_f0 = (_Elt_pointer)0x0;
  local_128._32_8_ = (_Elt_pointer)0x0;
  local_128._40_8_ = (_Map_pointer)0x0;
  local_128._16_8_ = (_Elt_pointer)0x0;
  local_128._24_8_ = (_Elt_pointer)0x0;
  local_128._0_8_ =
       (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
        *)0x0;
  local_128._8_8_ =
       (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
        *)0x0;
  std::deque<packing::ProtoPalAttrs,std::allocator<packing::ProtoPalAttrs>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>>>
            ((deque<packing::ProtoPalAttrs,std::allocator<packing::ProtoPalAttrs>> *)local_128,
             local_a8.
             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_a8.
             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::_Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::_Deque_base
            (&local_90,
             (_Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)
             local_128);
  std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::~deque
            ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)local_128);
  local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
  _M_impl.super__Vector_impl_data._M_start = (AssignedProtos *)0x0;
  local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
  _M_impl.super__Vector_impl_data._M_finish = (AssignedProtos *)0x0;
  local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_90._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_90._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pPVar35 = local_90._M_impl.super__Deque_impl_data._M_start._M_cur;
      Options::verbosePrint
                (&options,'\x04',"Handling proto-pal %zu\n",
                 (local_90._M_impl.super__Deque_impl_data._M_start._M_cur)->protoPalIndex);
      pAVar28 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pAVar42 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar26 = (((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)&local_180->_array)->
                _M_impl).super__Vector_impl_data._M_start + pPVar35->protoPalIndex;
      sVar13 = ProtoPalette::size(pPVar26);
      local_150 = (AssignedProtos *)((long)pAVar28 - (long)pAVar42 >> 5);
      pAVar43 = (AssignedProtos *)
                ((long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      auVar50._8_4_ = (int)(sVar13 >> 0x20);
      auVar50._0_8_ = sVar13;
      auVar50._12_4_ = 0x45300000;
      dVar52 = auVar50._8_8_ - 1.9342813113834067e+25;
      if (local_198.
          super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_198.
          super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_178 = (AssignedProtos *)
                    (dVar52 + ((double)CONCAT44(0x43300000,(int)sVar13) - 4503599627370496.0));
        pAVar47 = (AssignedProtos *)0x0;
        dStack_170 = dVar52;
        do {
          p_Var1 = (pPVar35->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          if (pAVar47 < (AssignedProtos *)
                        ((ulong)(pPVar35->bannedPages).super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                _M_offset +
                        ((long)(pPVar35->bannedPages).super__Bvector_base<std::allocator<bool>_>.
                               _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                               _M_p - (long)p_Var1) * 8)) {
            pAVar21 = (AssignedProtos *)((long)&pAVar47[1]._protoPals + 7);
            if (-1 < (long)pAVar47) {
              pAVar21 = pAVar47;
            }
            if ((p_Var1[((long)pAVar21 >> 6) +
                        (ulong)(((ulong)pAVar47 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff] >> ((ulong)pAVar47 & 0x3f) & 1) == 0) goto LAB_001072e3;
          }
          else {
LAB_001072e3:
            dVar52 = AssignedProtos::relSizeOf
                               (local_198.
                                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)pAVar47,pPVar26);
            in_R9 = (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                    ProtoPalette::size(pPVar26);
            Options::verbosePrint
                      (&options,'\x04',"%zu/%zu: Rel size: %f (size = %zu)\n",dVar52,
                       (undefined1 *)
                       ((long)&(pAVar47->_assigned).
                               super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1),pAVar43);
            dVar52 = AssignedProtos::relSizeOf
                               (local_198.
                                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)pAVar47,pPVar26);
            if (dVar52 < (double)local_178) {
              local_150 = pAVar47;
            }
          }
          pAVar47 = (AssignedProtos *)
                    ((long)&(pAVar47->_assigned).
                            super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
          pAVar43 = (AssignedProtos *)
                    ((long)local_198.
                           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_198.
                           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
        } while (pAVar47 < pAVar43);
      }
      if (local_150 == pAVar43) {
        std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>::
        emplace_back<std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&,packing::ProtoPalAttrs_const>
                  ((vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>> *)
                   &local_198,(vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)local_180,
                   pPVar35);
      }
      else {
        pAVar43 = local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)local_150;
        AssignedProtos::assign<packing::ProtoPalAttrs_const>(pAVar43,pPVar35);
        local_130 = pAVar43;
        while (puVar14 = AssignedProtos::uniqueColors(pAVar43),
              (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels) <
              (puVar14->_M_h)._M_element_count) {
          puVar14 = AssignedProtos::uniqueColors(pAVar43);
          _Var38._M_current = (optional<packing::ProtoPalAttrs> *)(puVar14->_M_h)._M_element_count;
          in_R9 = (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                  (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels);
          pAVar47 = local_150;
          Options::verbosePrint(&options,'\x04',"Palette %zu is overloaded! (%zu > %u)\n");
          p_Var41 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                    (pAVar43->_assigned).
                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (_Var32._M_current =
                    (pAVar43->_assigned).
                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current != p_Var41 &&
              (*(bool *)((_Storage<packing::ProtoPalAttrs,_false> *)
                         &(_Var32._M_current)->
                          super__Optional_base<packing::ProtoPalAttrs,_false,_false> + 1) == false))
              ; _Var32._M_current = _Var32._M_current + 1) {
          }
          local_128._0_8_ = local_d0;
          local_128._8_8_ = local_180;
          _Var44._M_current = _Var32._M_current;
          local_d0._0_8_ = pAVar43;
          if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current != p_Var41) {
            _Var31._M_current = _Var32._M_current;
            do {
              p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var31._M_current + 1;
              if (p_Var33 == p_Var41) break;
              p_Var29 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var31._M_current + 1;
              _Var31._M_current = (optional<packing::ProtoPalAttrs> *)p_Var33;
            } while (p_Var29->_M_engaged == false);
            if (p_Var33 != p_Var41) {
              __it1._iter._M_current = _Var32._M_current;
              __it1._array = (remove_const_t<decltype(_assigned)> *)p_Var33;
              __it2._iter._M_current = _Var38._M_current;
              __it2._array = &pAVar47->_assigned;
              bVar12 = __gnu_cxx::__ops::
                       _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                       ::operator()(local_128,__it1,__it2);
              _Var31._M_current = (optional<packing::ProtoPalAttrs> *)p_Var33;
              if (!bVar12) {
                _Var44._M_current = (optional<packing::ProtoPalAttrs> *)p_Var33;
                _Var31._M_current = _Var32._M_current;
              }
              p_Var29 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                        (pAVar43->_assigned).
                        super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              do {
                _Var27._M_current = (optional<packing::ProtoPalAttrs> *)(p_Var33 + 1);
                if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var27._M_current == p_Var29)
                break;
                p_Var39 = p_Var33 + 1;
                p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var27._M_current;
              } while (p_Var39->_M_engaged == false);
              _Var32._M_current = _Var31._M_current;
              p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var27._M_current;
              pAVar21 = pAVar43;
              pAVar10 = pAVar43;
              if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var27._M_current != p_Var41) {
LAB_0010762e:
                do {
                  local_178 = pAVar10;
                  local_160 = pAVar21;
                  p_Var39 = p_Var33 + 1;
                  if (p_Var39 != p_Var29) {
                    p_Var5 = p_Var33 + 1;
                    p_Var33 = p_Var39;
                    pAVar21 = local_160;
                    pAVar10 = local_178;
                    if (p_Var5->_M_engaged == false) goto LAB_0010762e;
                  }
                  _Var32._M_current = _Var31._M_current;
                  if (p_Var39 == p_Var41) {
                    __it1_05._iter._M_current = _Var31._M_current;
                    __it1_05._array = (remove_const_t<decltype(_assigned)> *)_Var27._M_current;
                    __it2_05._iter._M_current = _Var38._M_current;
                    __it2_05._array = &pAVar47->_assigned;
                    bVar12 = __gnu_cxx::__ops::
                             _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                             ::operator()(local_128,__it1_05,__it2_05);
                    pAVar43 = local_130;
                    _Var32._M_current = _Var27._M_current;
                    if ((!bVar12) &&
                       (__it1_06._iter._M_current = _Var44._M_current,
                       __it1_06._array = (remove_const_t<decltype(_assigned)> *)_Var27._M_current,
                       __it2_06._iter._M_current = _Var38._M_current,
                       __it2_06._array = &pAVar47->_assigned,
                       bVar12 = __gnu_cxx::__ops::
                                _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                                ::operator()(local_128,__it1_06,__it2_06),
                       _Var32._M_current = _Var31._M_current, !bVar12)) {
                      _Var44._M_current = _Var27._M_current;
                    }
                    break;
                  }
                  __it1_00._iter._M_current = _Var27._M_current;
                  __it1_00._array = (remove_const_t<decltype(_assigned)> *)p_Var39;
                  __it2_00._iter._M_current = _Var38._M_current;
                  __it2_00._array = &pAVar47->_assigned;
                  bVar12 = __gnu_cxx::__ops::
                           _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                           ::operator()(local_128,__it1_00,__it2_00);
                  if (bVar12) {
                    __it1_01._iter._M_current = _Var31._M_current;
                    __it1_01._array = (remove_const_t<decltype(_assigned)> *)p_Var39;
                    __it2_01._iter._M_current = _Var38._M_current;
                    __it2_01._array = &pAVar47->_assigned;
                    bVar12 = __gnu_cxx::__ops::
                             _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                             ::operator()(local_128,__it1_01,__it2_01);
                    __it1_02._iter._M_current = _Var44._M_current;
                    __it1_02._array = (remove_const_t<decltype(_assigned)> *)_Var27._M_current;
                    __it2_02._iter._M_current = _Var38._M_current;
                    __it2_02._array = &pAVar47->_assigned;
                    bVar11 = __gnu_cxx::__ops::
                             _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                             ::operator()(local_128,__it1_02,__it2_02);
                    if (bVar12) {
                      local_160 = local_130;
                      _Var32._M_current = (optional<packing::ProtoPalAttrs> *)p_Var39;
                    }
                    if (!bVar11) {
                      _Var44._M_current = _Var27._M_current;
                      local_178 = local_130;
                    }
                  }
                  else {
                    __it1_03._iter._M_current = _Var31._M_current;
                    __it1_03._array = (remove_const_t<decltype(_assigned)> *)_Var27._M_current;
                    __it2_03._iter._M_current = _Var38._M_current;
                    __it2_03._array = &pAVar47->_assigned;
                    bVar12 = __gnu_cxx::__ops::
                             _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                             ::operator()(local_128,__it1_03,__it2_03);
                    __it1_04._iter._M_current = _Var44._M_current;
                    __it1_04._array = (remove_const_t<decltype(_assigned)> *)p_Var39;
                    __it2_04._iter._M_current = _Var38._M_current;
                    __it2_04._array = &pAVar47->_assigned;
                    bVar11 = __gnu_cxx::__ops::
                             _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                             ::operator()(local_128,__it1_04,__it2_04);
                    if (bVar12) {
                      local_160 = local_130;
                      _Var32._M_current = _Var27._M_current;
                    }
                    if (!bVar11) {
                      _Var44._M_current = (optional<packing::ProtoPalAttrs> *)p_Var39;
                      local_178 = local_130;
                    }
                  }
                  p_Var29 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                            (local_130->_assigned).
                            super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  do {
                    _Var27._M_current = (optional<packing::ProtoPalAttrs> *)(p_Var39 + 1);
                    if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var27._M_current ==
                        p_Var29) break;
                    p_Var33 = p_Var39 + 1;
                    p_Var39 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var27._M_current;
                  } while (p_Var33->_M_engaged == false);
                  pAVar43 = local_130;
                  p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var27._M_current;
                  pAVar21 = local_160;
                  pAVar10 = local_178;
                  _Var31._M_current = _Var32._M_current;
                  pAVar47 = local_160;
                  if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var27._M_current == p_Var41
                     ) break;
                } while( true );
              }
            }
          }
          if (((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var44._M_current)->_M_engaged ==
              false) goto LAB_00108589;
          pPVar26 = (((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                     &local_180->_array)->_M_impl).super__Vector_impl_data._M_start +
                    (((_Optional_payload<packing::ProtoPalAttrs,_false,_false,_false> *)
                     &(((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var44._M_current)->
                      _M_payload)._M_value.protoPalIndex)->
                    super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>).
                    super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                    protoPalIndex;
          sVar13 = ProtoPalette::size(pPVar26);
          dVar52 = AssignedProtos::relSizeOf((AssignedProtos *)local_d0._0_8_,pPVar26);
          auVar51._8_4_ = (int)(sVar13 >> 0x20);
          auVar51._0_8_ = sVar13;
          auVar51._12_4_ = 0x45300000;
          if (((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current)->_M_engaged ==
              false) goto LAB_00108589;
          pPVar26 = (((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                     &local_180->_array)->_M_impl).super__Vector_impl_data._M_start +
                    (((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current)->
                    _M_payload)._M_value.protoPalIndex;
          local_178 = (AssignedProtos *)
                      ((double)CONCAT44(0x43300000,(int)sVar13) - 4503599627370496.0);
          dStack_170 = auVar51._8_8_ - 1.9342813113834067e+25;
          sVar13 = ProtoPalette::size(pPVar26);
          dVar49 = AssignedProtos::relSizeOf((AssignedProtos *)local_d0._0_8_,pPVar26);
          auVar53._8_4_ = (int)(sVar13 >> 0x20);
          auVar53._0_8_ = sVar13;
          auVar53._12_4_ = 0x45300000;
          if ((dStack_170 + (double)local_178) / dVar52 -
              ((auVar53._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar13) - 4503599627370496.0)) / dVar49 < 0.001)
          break;
          if (((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current)->_M_engaged ==
              false) goto LAB_00108589;
          std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::
          emplace_back<packing::ProtoPalAttrs>
                    ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)
                     &local_90,(ProtoPalAttrs *)_Var32._M_current);
          pPVar35 = local_90._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_90._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_90._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pPVar35 = local_90._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
          }
          ProtoPalAttrs::banFrom(pPVar35 + -1,(size_t)local_150);
          std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset
                    ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current);
        }
      }
      std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::pop_front
                ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)&local_90
                );
      pAVar42 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (local_90._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_90._M_impl.super__Deque_impl_data._M_start._M_cur);
    if (local_198.
        super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_198.
        super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pAVar28 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        puVar14 = AssignedProtos::uniqueColors(pAVar28);
        if ((ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels) <
            (puVar14->_M_h)._M_element_count) {
          p_Var41 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                    (pAVar28->_assigned).
                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                    (pAVar28->_assigned).
                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (p_Var29 = p_Var33; (p_Var29 != p_Var41 && (p_Var29->_M_engaged == false));
              p_Var29 = p_Var29 + 1) {
          }
          if (p_Var29 != p_Var41) {
            do {
              if (p_Var29->_M_engaged == false) goto LAB_00108589;
              std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::
              emplace_back<packing::ProtoPalAttrs>
                        ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)
                         &local_90,(ProtoPalAttrs *)p_Var29);
              p_Var39 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                        (pAVar28->_assigned).
                        super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              p_Var33 = p_Var29;
              do {
                p_Var29 = p_Var33 + 1;
                if (p_Var29 == p_Var39) break;
                p_Var5 = p_Var33 + 1;
                p_Var33 = p_Var29;
              } while (p_Var5->_M_engaged == false);
            } while (p_Var29 != p_Var41);
            p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                      (pAVar28->_assigned).
                      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            p_Var41 = p_Var39;
          }
          p_Var29 = p_Var33;
          if (p_Var41 != p_Var33) {
            do {
              std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset(p_Var29);
              p_Var29 = p_Var29 + 1;
            } while (p_Var29 != p_Var41);
            (pAVar28->_assigned).
            super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var33;
          }
        }
        pAVar28 = pAVar28 + 1;
      } while (pAVar28 != pAVar42);
    }
  }
  if (local_90._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_90._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pPVar35 = local_90._M_impl.super__Deque_impl_data._M_start._M_cur;
      pAVar42 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pPVar26 = (((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)&local_180->_array)->
                _M_impl).super__Vector_impl_data._M_start +
                (local_90._M_impl.super__Deque_impl_data._M_start._M_cur)->protoPalIndex;
      lVar46 = (long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pAVar28 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < lVar46 >> 7) {
        lVar40 = (lVar46 >> 7) + 1;
        do {
          bVar12 = AssignedProtos::canFit(pAVar28,pPVar26);
          pAVar43 = pAVar28;
          if (bVar12) goto LAB_00107977;
          bVar12 = AssignedProtos::canFit(pAVar28 + 1,pPVar26);
          pAVar43 = pAVar28 + 1;
          if (bVar12) goto LAB_00107977;
          bVar12 = AssignedProtos::canFit(pAVar28 + 2,pPVar26);
          pAVar43 = pAVar28 + 2;
          if (bVar12) goto LAB_00107977;
          bVar12 = AssignedProtos::canFit(pAVar28 + 3,pPVar26);
          pAVar43 = pAVar28 + 3;
          if (bVar12) goto LAB_00107977;
          pAVar28 = pAVar28 + 4;
          lVar40 = lVar40 + -1;
          lVar46 = lVar46 + -0x80;
        } while (1 < lVar40);
      }
      lVar46 = lVar46 >> 5;
      if (lVar46 == 1) {
LAB_00107963:
        bVar12 = AssignedProtos::canFit(pAVar28,pPVar26);
        pAVar43 = pAVar42;
        if (bVar12) {
          pAVar43 = pAVar28;
        }
      }
      else if (lVar46 == 2) {
LAB_00107941:
        bVar12 = AssignedProtos::canFit(pAVar28,pPVar26);
        pAVar43 = pAVar28;
        if (!bVar12) {
          pAVar28 = pAVar28 + 1;
          goto LAB_00107963;
        }
      }
      else {
        pAVar43 = pAVar42;
        if ((lVar46 == 3) &&
           (bVar12 = AssignedProtos::canFit(pAVar28,pPVar26), pAVar43 = pAVar28, !bVar12)) {
          pAVar28 = pAVar28 + 1;
          goto LAB_00107941;
        }
      }
LAB_00107977:
      if (pAVar43 ==
          local_198.
          super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        Options::verbosePrint
                  (&options,'\x04',"Adding new palette (%zu) for overflowing proto-pal %zu\n",
                   (long)pAVar43 -
                   (long)local_198.
                         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5,pPVar35->protoPalIndex);
        std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>::
        emplace_back<std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&,packing::ProtoPalAttrs_const>
                  ((vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>> *)
                   &local_198,(vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)local_180,
                   pPVar35);
      }
      else {
        Options::verbosePrint
                  (&options,'\x04',"Assigning overflowing proto-pal %zu to palette %zu\n",
                   pPVar35->protoPalIndex,
                   (long)pAVar43 -
                   (long)local_198.
                         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
        AssignedProtos::assign<packing::ProtoPalAttrs_const>(pAVar43,pPVar35);
      }
      std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::pop_front
                ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)&local_90
                );
    } while (local_90._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_90._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  pAVar42 = local_198.
            super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((2 < options.verbosity) &&
     (pAVar42 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_finish,
     local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    local_178 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pAVar28 = local_198.
              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      fwrite("{ ",2,1,_stderr);
      poVar34 = (pAVar28->_assigned).
                super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar48 = (pAVar28->_assigned).
                super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while ((pFVar4 = _stderr, poVar34 != poVar48 &&
             ((poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
              super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
              super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false))) {
        poVar34 = poVar34 + 1;
      }
joined_r0x00107a7e:
      _stderr = pFVar4;
      if (poVar34 != poVar48) {
        if ((poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
            super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
            super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false)
        goto LAB_00108589;
        fprintf(pFVar4,"[%zu] ",
                (poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                protoPalIndex);
        pPVar26 = (((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)&local_180->_array)
                  ->_M_impl).super__Vector_impl_data._M_start +
                  (poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                  super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                  super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                  protoPalIndex;
        puVar15 = ProtoPalette::begin(pPVar26);
        pvVar16 = ProtoPalette::end(pPVar26);
        for (; puVar15 != pvVar16; puVar15 = puVar15 + 1) {
          fprintf(_stderr,"%04x, ",(ulong)*puVar15);
        }
        poVar37 = poVar34;
        do {
          poVar34 = poVar37 + 1;
          pFVar4 = _stderr;
          if (poVar34 ==
              (pAVar28->_assigned).
              super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) break;
          poVar6 = poVar37 + 1;
          poVar37 = poVar34;
        } while ((poVar6->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                 super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                 super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false);
        goto joined_r0x00107a7e;
      }
      puVar14 = AssignedProtos::uniqueColors(pAVar28);
      fprintf(pFVar4,"} (volume = %zu)\n",(puVar14->_M_h)._M_element_count);
      pAVar28 = pAVar28 + 1;
      pAVar42 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (pAVar28 != local_178);
  }
  Options::verbosePrint
            (&options,'\x04',"%zu palettes before decanting\n",
             (long)local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar42 >> 5);
  pAVar43 = (AssignedProtos *)
            (((long)local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
  if (pAVar43 == (AssignedProtos *)0x0) {
    lVar46 = 1;
  }
  else {
    do {
      local_160 = (AssignedProtos *)((long)pAVar43 << 5);
      pAVar47 = (AssignedProtos *)0x0;
      local_178 = pAVar43;
      do {
        pIVar45 = *(Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                    **)((long)&(local_160->_assigned).
                               super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                       (long)&((local_198.
                                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                              super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        local_128._8_8_ =
             *(long *)((long)&((local_198.
                                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                              super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + (long)local_160);
        while ((pIVar45 !=
                (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                 *)local_128._8_8_ &&
               (*(char *)&(((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                           &pIVar45[3]._array)->_M_impl).super__Vector_impl_data._M_start == '\0')))
        {
          pIVar45 = (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                     *)&pIVar45[3]._iter;
        }
        pAVar21 = local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)pAVar47;
        puVar14 = (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                   *)((long)&(local_160->_assigned).
                             super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (long)&((local_198.
                              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                            super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        local_128._0_8_ = puVar14;
        pAVar43 = (AssignedProtos *)AssignedProtos::uniqueColors(pAVar21);
        iter._iter._M_current = (optional<packing::ProtoPalAttrs> *)local_128;
        iter._array = (remove_const_t<decltype(_assigned)> *)pIVar45;
        AssignedProtos::
        addUniqueColors<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>>
                  (pAVar43,puVar14,iter,local_180,in_R9);
        if (pAVar43->_protoPals <=
            (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
            (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels)) {
          p_Var41 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                    (puVar14->_M_h)._M_bucket_count;
          p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)(puVar14->_M_h)._M_buckets;
          for (p_Var29 = p_Var33; (p_Var29 != p_Var41 && (p_Var29->_M_engaged == false));
              p_Var29 = p_Var29 + 1) {
          }
          if (p_Var29 != p_Var41) {
            do {
              if (p_Var29->_M_engaged == false) goto LAB_00108589;
              AssignedProtos::assign<unsigned_long_const&>(pAVar21,(unsigned_long *)p_Var29);
              p_Var39 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                        (puVar14->_M_h)._M_bucket_count;
              p_Var33 = p_Var29;
              do {
                p_Var29 = p_Var33 + 1;
                if (p_Var29 == p_Var39) break;
                p_Var5 = p_Var33 + 1;
                p_Var33 = p_Var29;
              } while (p_Var5->_M_engaged == false);
            } while (p_Var29 != p_Var41);
            p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)(puVar14->_M_h)._M_buckets;
            p_Var41 = p_Var39;
          }
          p_Var29 = p_Var33;
          if (p_Var41 != p_Var33) {
            do {
              std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset(p_Var29);
              p_Var29 = p_Var29 + 1;
            } while (p_Var29 != p_Var41);
            (puVar14->_M_h)._M_bucket_count = (size_type)p_Var33;
          }
        }
        pAVar21 = local_160;
        pAVar43 = local_178;
        pAVar42 = local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar47 = (AssignedProtos *)
                  ((long)&(pAVar47->_assigned).
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
      } while (pAVar47 < local_178);
      _Var17 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,__gnu_cxx::__ops::_Iter_pred<packing::AssignedProtos::empty()const::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>>
                         (*(undefined8 *)
                           ((long)&(local_160->_assigned).
                                   super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (long)&((local_198.
                                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                                  super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start),
                          *(undefined8 *)
                           ((long)&((local_198.
                                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                                   super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + (long)local_160));
      if (_Var17._M_current ==
          *(optional<packing::ProtoPalAttrs> **)
           ((long)&(pAVar21->_assigned).
                   super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
           (long)&(pAVar42->_assigned).
                  super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) {
        std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::_M_erase
                  (&local_198,
                   (AssignedProtos *)
                   ((long)&((local_198.
                             super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                           super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                   (long)&(pAVar21->_assigned).
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_start));
      }
      pAVar43 = (AssignedProtos *)((long)&pAVar43[-1]._protoPals + 7);
    } while (pAVar43 != (AssignedProtos *)0x0);
    lVar46 = (long)local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  Options::verbosePrint(&options,'\x04',"%zu palettes after decanting on palettes\n",lVar46);
  pAVar43 = (AssignedProtos *)
            (((long)local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
  if (pAVar43 == (AssignedProtos *)0x0) {
    lVar46 = 1;
  }
  else {
    do {
      pAVar47 = (AssignedProtos *)((long)pAVar43 << 5);
      pAVar21 = (AssignedProtos *)0x0;
      local_150 = pAVar47;
      local_130 = pAVar43;
      do {
        local_178 = local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pAVar43 = (AssignedProtos *)
                  ((long)&(pAVar47->_assigned).
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                  (long)&((local_198.
                           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                         super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        sVar13 = AssignedProtos::nbProtoPals(pAVar43);
        local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)local_d0,sVar13,(bool *)local_128,
                   (allocator_type *)&local_148);
        local_178 = local_178 + (long)pAVar21;
        local_128._0_8_ = local_128 + 0x30;
        local_128._8_8_ =
             (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
              *)0x1;
        local_128._16_8_ = (_Elt_pointer)0x0;
        local_128._24_8_ = (_Elt_pointer)0x0;
        local_128._32_4_ = 0x3f800000;
        local_128._40_8_ = (_Map_pointer)0x0;
        local_128._48_8_ = (_Elt_pointer)0x0;
        local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (unsigned_long *)0x0;
        local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
        local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
        local_160 = pAVar21;
        while( true ) {
          local_158._M_cur._0_1_ = 1;
          _Var54 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                             (local_d0._0_8_,0,local_d0._16_8_,local_d0._24_4_,&local_158);
          pAVar47 = local_150;
          pAVar21 = local_160;
          p_Var18 = (_Hash_node_base *)_Var54.super__Bit_iterator_base._M_p;
          uVar23 = _Var54.super__Bit_iterator_base._M_offset;
          if ((p_Var18 == (_Hash_node_base *)local_d0._16_8_) && (uVar23 == local_d0._24_4_)) break;
          poVar34 = (pAVar43->_assigned).
                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          poVar48 = (pAVar43->_assigned).
                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          while ((poVar34 != poVar48 &&
                 ((poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                  super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                  super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false))) {
            poVar34 = poVar34 + 1;
          }
          for (lVar46 = (ulong)uVar23 + ((long)p_Var18 - local_d0._0_8_) * 8; poVar37 = poVar34,
              pPVar35 = (_Elt_pointer)local_128._16_8_, lVar46 != 0; lVar46 = lVar46 + -1) {
            do {
              poVar34 = poVar37 + 1;
              if (poVar34 == poVar48) break;
              poVar6 = poVar37 + 1;
              poVar37 = poVar34;
            } while ((poVar6->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload
                     .super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                     super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false);
          }
          while (pPVar35 != (_Elt_pointer)0x0) {
            pPVar2 = (_Elt_pointer)pPVar35->protoPalIndex;
            operator_delete(pPVar35,0x10);
            pPVar35 = pPVar2;
          }
          memset((void *)local_128._0_8_,0,local_128._8_8_ << 3);
          local_128._16_8_ = (_Elt_pointer)0x0;
          local_128._24_8_ = (_Elt_pointer)0x0;
          if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
          }
          do {
            pPVar35 = (_Elt_pointer)local_128._16_8_;
            if ((poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false)
            goto LAB_00108589;
            pPVar26 = (((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                       &local_180->_array)->_M_impl).super__Vector_impl_data._M_start +
                      (poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
                      _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>
                      .super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                      protoPalIndex;
            if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_00107f5f:
              pvVar16 = ProtoPalette::begin(pPVar26);
              pvVar19 = ProtoPalette::end(pPVar26);
              local_158._M_cur = (__node_type *)local_128;
              for (; pvVar16 != pvVar19; pvVar16 = pvVar16 + 1) {
                std::
                _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_short_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
                          ((_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_128,pvVar16,&local_158);
              }
              local_158._M_cur =
                   (__node_type *)((ulong)uVar23 + ((long)p_Var18 - local_d0._0_8_) * 8);
              if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          (&local_148,
                           (iterator)
                           local_148.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,(unsigned_long *)&local_158);
              }
              else {
                *local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish = (unsigned_long)local_158._M_cur;
                local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              p_Var18->_M_nxt =
                   (_Hash_node_base *)((ulong)p_Var18->_M_nxt | 1L << ((byte)uVar23 & 0x3f));
            }
            else {
              pvVar16 = ProtoPalette::begin(pPVar26);
              pvVar19 = ProtoPalette::end(pPVar26);
              for (; pPVar35 != (_Elt_pointer)0x0; pPVar35 = (_Elt_pointer)pPVar35->protoPalIndex) {
                if (pvVar16 != pvVar19) {
                  pvVar25 = pvVar16;
                  do {
                    if (*(value_type_conflict2 *)
                         &(pPVar35->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
                        *pvVar25) goto LAB_00107f5f;
                    pvVar25 = pvVar25 + 1;
                  } while (pvVar25 != pvVar19);
                }
              }
            }
            bVar12 = uVar23 == 0x3f;
            uVar23 = uVar23 + 1;
            if (bVar12) {
              uVar23 = 0;
            }
            poVar48 = poVar34;
            do {
              poVar34 = poVar48 + 1;
              if (poVar34 ==
                  (pAVar43->_assigned).
                  super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
              poVar37 = poVar48 + 1;
              poVar48 = poVar34;
            } while ((poVar37->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
                     _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                     super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false);
            p_Var18 = p_Var18 + bVar12;
          } while ((p_Var18 != (_Hash_node_base *)local_d0._16_8_) || (uVar23 != local_d0._24_4_));
          local_158._M_cur = (__node_type *)local_128._16_8_;
          local_38._M_cur = (__node_type *)0x0;
          sVar20 = AssignedProtos::
                   combinedVolume<std::__detail::_Node_iterator<unsigned_short,true,false>>
                             (local_178,(_Node_iterator<unsigned_short,_true,_false> *)&local_158,
                              (_Node_iterator<unsigned_short,_true,_false> *)&local_38);
          puVar7 = local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (sVar20 <= (byte)(options.nbColorsPerPal - options.hasTransparentPixels)) {
            for (p_Var41 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                           (pAVar43->_assigned).
                           super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                (p_Var41 !=
                 (_Optional_payload_base<packing::ProtoPalAttrs> *)
                 (pAVar43->_assigned).
                 super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish && (p_Var41->_M_engaged == false));
                p_Var41 = p_Var41 + 1) {
            }
            if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              puVar30 = local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              uVar22 = 0;
              do {
                uVar3 = *puVar30;
                lVar46 = uVar3 - uVar22;
                if (lVar46 != 0) {
                  p_Var33 = p_Var41;
LAB_001080ec:
                  do {
                    p_Var41 = p_Var33 + 1;
                    if (p_Var41 !=
                        (_Optional_payload_base<packing::ProtoPalAttrs> *)
                        (pAVar43->_assigned).
                        super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      p_Var29 = p_Var33 + 1;
                      p_Var33 = p_Var41;
                      if (p_Var29->_M_engaged == false) goto LAB_001080ec;
                    }
                    lVar46 = lVar46 + -1;
                    p_Var33 = p_Var41;
                  } while (lVar46 != 0);
                }
                if (p_Var41->_M_engaged == false) goto LAB_00108589;
                AssignedProtos::assign<packing::ProtoPalAttrs>(local_178,(ProtoPalAttrs *)p_Var41);
                std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset(p_Var41);
                puVar30 = puVar30 + 1;
                uVar22 = uVar3;
              } while (puVar30 != puVar7);
            }
          }
        }
        if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
          operator_delete(local_148.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_128);
        pAVar43 = local_130;
        if ((AssignedProtos *)local_d0._0_8_ != (AssignedProtos *)0x0) {
          operator_delete((void *)local_d0._0_8_,local_d0._32_8_ - local_d0._0_8_);
        }
        pAVar42 = local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar21 = (AssignedProtos *)
                  ((long)&(pAVar21->_assigned).
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
      } while (pAVar21 < pAVar43);
      _Var17 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,__gnu_cxx::__ops::_Iter_pred<packing::AssignedProtos::empty()const::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>>
                         (*(undefined8 *)
                           ((long)&(pAVar47->_assigned).
                                   super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (long)&((local_198.
                                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                                  super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start),
                          *(undefined8 *)
                           ((long)&((local_198.
                                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                                   super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + (long)pAVar47));
      if (_Var17._M_current ==
          *(optional<packing::ProtoPalAttrs> **)
           ((long)&(pAVar47->_assigned).
                   super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
           (long)&(pAVar42->_assigned).
                  super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) {
        std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::_M_erase
                  (&local_198,
                   (AssignedProtos *)
                   ((long)&((local_198.
                             super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                           super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                   (long)&(pAVar47->_assigned).
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_start));
      }
      pAVar43 = (AssignedProtos *)((long)&pAVar43[-1]._protoPals + 7);
    } while (pAVar43 != (AssignedProtos *)0x0);
    lVar46 = (long)local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  Options::verbosePrint(&options,'\x04',"%zu palettes after decanting on \"components\"\n",lVar46);
  uVar36 = ((long)local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
  if (uVar36 == 0) {
    lVar46 = 1;
  }
  else {
    do {
      uVar24 = 0;
      do {
        pAVar42 = local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar36]._assigned.
                  super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (p_Var41 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                       local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar36]._assigned.
                       super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            (p_Var41 != p_Var33 && (p_Var41->_M_engaged == false)); p_Var41 = p_Var41 + 1) {
        }
        if (p_Var41 != p_Var33) {
          pAVar43 = local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar24;
          do {
            if (p_Var41->_M_engaged == false) goto LAB_00108589;
            bVar12 = AssignedProtos::canFit
                               (pAVar43,(((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>
                                           *)&local_180->_array)->_M_impl).super__Vector_impl_data.
                                        _M_start + (p_Var41->_M_payload)._M_value.protoPalIndex);
            if (bVar12) {
              if (p_Var41->_M_engaged == false) goto LAB_00108589;
              AssignedProtos::assign<packing::ProtoPalAttrs>(pAVar43,(ProtoPalAttrs *)p_Var41);
              std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset(p_Var41);
            }
            p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                      pAVar42[uVar36]._assigned.
                      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            p_Var29 = p_Var41;
            do {
              p_Var41 = p_Var29 + 1;
              if (p_Var41 == p_Var33) break;
              p_Var39 = p_Var29 + 1;
              p_Var29 = p_Var41;
            } while (p_Var39->_M_engaged == false);
          } while (p_Var41 != p_Var33);
        }
        pAVar42 = local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar24 = uVar24 + 1;
      } while (uVar24 < uVar36);
      _Var17 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,__gnu_cxx::__ops::_Iter_pred<packing::AssignedProtos::empty()const::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>>
                         (local_198.
                          super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar36]._assigned.
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_198.
                          super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar36]._assigned.
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      if (_Var17._M_current ==
          pAVar42[uVar36]._assigned.
          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::_M_erase
                  (&local_198,
                   local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar36);
      }
      uVar36 = uVar36 - 1;
    } while (uVar36 != 0);
    lVar46 = (long)local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  Options::verbosePrint(&options,'\x04',"%zu palettes after decanting on proto-palettes\n",lVar46);
  if ((2 < options.verbosity) &&
     (local_178 = local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
     pAVar43 = local_198.
               super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
               ._M_impl.super__Vector_impl_data._M_start,
     local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      fwrite("{ ",2,1,_stderr);
      poVar34 = (pAVar43->_assigned).
                super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar48 = (pAVar43->_assigned).
                super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while ((pFVar4 = _stderr, poVar34 != poVar48 &&
             ((poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
              super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
              super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false))) {
        poVar34 = poVar34 + 1;
      }
joined_r0x00108380:
      _stderr = pFVar4;
      if (poVar34 != poVar48) {
        if ((poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
            super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
            super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false)
        goto LAB_00108589;
        fprintf(pFVar4,"[%zu] ",
                (poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                protoPalIndex);
        pPVar26 = (((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)&local_180->_array)
                  ->_M_impl).super__Vector_impl_data._M_start +
                  (poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                  super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                  super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                  protoPalIndex;
        puVar15 = ProtoPalette::begin(pPVar26);
        pvVar16 = ProtoPalette::end(pPVar26);
        for (; puVar15 != pvVar16; puVar15 = puVar15 + 1) {
          fprintf(_stderr,"%04x, ",(ulong)*puVar15);
        }
        poVar37 = poVar34;
        do {
          poVar34 = poVar37 + 1;
          pFVar4 = _stderr;
          if (poVar34 ==
              (pAVar43->_assigned).
              super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) break;
          poVar6 = poVar37 + 1;
          poVar37 = poVar34;
        } while ((poVar6->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                 super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                 super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false);
        goto joined_r0x00108380;
      }
      puVar14 = AssignedProtos::uniqueColors(pAVar43);
      fprintf(pFVar4,"} (volume = %zu)\n",(puVar14->_M_h)._M_element_count);
      pAVar43 = pAVar43 + 1;
    } while (pAVar43 != local_178);
  }
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
            *)local_128,
           (long)(local_180->_iter)._M_current -
           (long)(((_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_> *)&local_180->_array)
                 ->_M_impl).super__Vector_impl_data._M_start >> 3,(allocator_type *)local_d0);
  ptVar8 = local_40;
  uVar22 = (long)local_198.
                 super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_198.
                 super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (local_198.
      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_198.
      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>._M_impl.
      super__Vector_impl_data._M_start) {
    p_Var18 = (_Hash_node_base *)0x0;
    do {
      poVar34 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)p_Var18]._assigned.
                super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar48 = local_198.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)p_Var18]._assigned.
                super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while ((poVar34 != poVar48 &&
             ((poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
              super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
              super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false))) {
        poVar34 = poVar34 + 1;
      }
joined_r0x001084d8:
      if (poVar34 != poVar48) {
        if ((poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
            super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
            super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false) {
LAB_00108589:
          __assert_fail("(*_iter).has_value()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_packing.cpp"
                        ,0x72,
                        "reference packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs> *, std::vector<std::optional<packing::ProtoPalAttrs>>>, std::remove_const_t>::operator*() const [Inner = __gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs> *, std::vector<std::optional<packing::ProtoPalAttrs>>>, Constness = std::remove_const_t]"
                       );
        }
        ((_Hash_node_base *)
        (local_128._0_8_ +
        (poVar34->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
        super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
        super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.protoPalIndex * 8))
        ->_M_nxt = p_Var18;
        poVar37 = poVar34;
        do {
          poVar34 = poVar37 + 1;
          if (poVar34 == poVar48) break;
          poVar6 = poVar37 + 1;
          poVar37 = poVar34;
        } while ((poVar6->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                 super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                 super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false);
        goto joined_r0x001084d8;
      }
      p_Var18 = (_Hash_node_base *)((long)&p_Var18->_M_nxt + 1);
    } while (p_Var18 != (_Hash_node_base *)(uVar22 + (uVar22 == 0)));
  }
  (local_40->
  super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       uVar22;
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector(&(local_40->
            super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
            ).
            super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
            ._M_head_impl,
           (vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
            *)local_128);
  if ((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
       *)local_128._0_8_ !=
      (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
       *)0x0) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
  }
  std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::~vector
            (&local_198);
  std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::~deque
            ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)&local_90);
  if ((__node_base_ptr)
      local_a8.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (__node_base_ptr)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return ptVar8;
}

Assistant:

std::tuple<DefaultInitVec<size_t>, size_t>
    overloadAndRemove(std::vector<ProtoPalette> const &protoPalettes) {
	options.verbosePrint(Options::VERB_LOG_ACT,
	                     "Paginating palettes using \"overload-and-remove\" strategy...\n");

	// Sort the proto-palettes by size, which improves the packing algorithm's efficiency
	DefaultInitVec<size_t> sortedProtoPalIDs(protoPalettes.size());
	sortedProtoPalIDs.clear();
	for (size_t i = 0; i < protoPalettes.size(); ++i) {
		sortedProtoPalIDs.insert(
		    std::lower_bound(sortedProtoPalIDs.begin(), sortedProtoPalIDs.end(), i), i);
	}
	// Begin with all proto-palettes queued up for insertion
	std::queue<ProtoPalAttrs> queue(
	    std::deque<ProtoPalAttrs>(sortedProtoPalIDs.begin(), sortedProtoPalIDs.end()));
	// Begin with no pages
	std::vector<AssignedProtos> assignments{};

	for (; !queue.empty(); queue.pop()) {
		ProtoPalAttrs const &attrs = queue.front(); // Valid until the `queue.pop()`
		options.verbosePrint(Options::VERB_DEBUG, "Handling proto-pal %zu\n", attrs.protoPalIndex);

		ProtoPalette const &protoPal = protoPalettes[attrs.protoPalIndex];
		size_t bestPalIndex = assignments.size();
		// We're looking for a palette where the proto-palette's relative size is less than
		// its actual size; so only overwrite the "not found" index on meeting that criterion
		double bestRelSize = protoPal.size();

		for (size_t i = 0; i < assignments.size(); ++i) {
			// Skip the page if this one is banned from it
			if (attrs.isBannedFrom(i)) {
				continue;
			}

			options.verbosePrint(Options::VERB_DEBUG, "%zu/%zu: Rel size: %f (size = %zu)\n", i + 1,
			                     assignments.size(), assignments[i].relSizeOf(protoPal),
			                     protoPal.size());
			if (assignments[i].relSizeOf(protoPal) < bestRelSize) {
				bestPalIndex = i;
			}
		}

		if (bestPalIndex == assignments.size()) {
			// Found nowhere to put it, create a new page containing just that one
			assignments.emplace_back(protoPalettes, std::move(attrs));
		} else {
			auto &bestPal = assignments[bestPalIndex];
			// Add the color to that palette
			bestPal.assign(std::move(attrs));

			// If this overloads the palette, get it back to normal (if possible)
			while (bestPal.volume() > options.maxOpaqueColors()) {
				options.verbosePrint(Options::VERB_DEBUG,
				                     "Palette %zu is overloaded! (%zu > %" PRIu8 ")\n",
				                     bestPalIndex, bestPal.volume(), options.maxOpaqueColors());

				// Look for a proto-pal minimizing "efficiency" (size / rel_size)
				auto efficiency = [&bestPal](ProtoPalette const &pal) {
					return pal.size() / bestPal.relSizeOf(pal);
				};
				auto [minEfficiencyIter, maxEfficiencyIter] =
				    std::minmax_element(bestPal.begin(), bestPal.end(),
				                        [&efficiency, &protoPalettes](ProtoPalAttrs const &lhs,
				                                                      ProtoPalAttrs const &rhs) {
					                        return efficiency(protoPalettes[lhs.protoPalIndex])
					                               < efficiency(protoPalettes[rhs.protoPalIndex]);
				                        });

				// All efficiencies are identical iff min equals max
				// TODO: maybe not ideal to re-compute these two?
				// TODO: yikes for float comparison! I *think* this threshold is OK?
				if (efficiency(protoPalettes[maxEfficiencyIter->protoPalIndex])
				        - efficiency(protoPalettes[minEfficiencyIter->protoPalIndex])
				    < .001) {
					break;
				}

				// Remove the proto-pal with minimal efficiency
				queue.emplace(std::move(*minEfficiencyIter));
				queue.back().banFrom(bestPalIndex); // Ban it from this palette
				bestPal.remove(minEfficiencyIter);
			}
		}
	}

	// Deal with palettes still overloaded, by emptying them
	for (AssignedProtos &pal : assignments) {
		if (pal.volume() > options.maxOpaqueColors()) {
			for (ProtoPalAttrs &attrs : pal) {
				queue.emplace(std::move(attrs));
			}
			pal.clear();
		}
	}
	// Place back any proto-palettes now in the queue via first-fit
	while (!queue.empty()) {
		ProtoPalAttrs const &attrs = queue.front();
		ProtoPalette const &protoPal = protoPalettes[attrs.protoPalIndex];
		auto iter =
		    std::find_if(assignments.begin(), assignments.end(),
		                 [&protoPal](AssignedProtos const &pal) { return pal.canFit(protoPal); });
		if (iter == assignments.end()) { // No such page, create a new one
			options.verbosePrint(Options::VERB_DEBUG,
			                     "Adding new palette (%zu) for overflowing proto-pal %zu\n",
			                     assignments.size(), attrs.protoPalIndex);
			assignments.emplace_back(protoPalettes, std::move(attrs));
		} else {
			options.verbosePrint(Options::VERB_DEBUG,
			                     "Assigning overflowing proto-pal %zu to palette %zu\n",
			                     attrs.protoPalIndex, iter - assignments.begin());
			iter->assign(std::move(attrs));
		}
		queue.pop();
	}

	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto &&assignment : assignments) {
			fprintf(stderr, "{ ");
			for (auto &&attrs : assignment) {
				fprintf(stderr, "[%zu] ", attrs.protoPalIndex);
				for (auto &&colorIndex : protoPalettes[attrs.protoPalIndex]) {
					fprintf(stderr, "%04" PRIx16 ", ", colorIndex);
				}
			}
			fprintf(stderr, "} (volume = %zu)\n", assignment.volume());
		}
	}

	// "Decant" the result
	decant(assignments, protoPalettes);
	// Note that the result does not contain any empty palettes

	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto &&assignment : assignments) {
			fprintf(stderr, "{ ");
			for (auto &&attrs : assignment) {
				fprintf(stderr, "[%zu] ", attrs.protoPalIndex);
				for (auto &&colorIndex : protoPalettes[attrs.protoPalIndex]) {
					fprintf(stderr, "%04" PRIx16 ", ", colorIndex);
				}
			}
			fprintf(stderr, "} (volume = %zu)\n", assignment.volume());
		}
	}

	DefaultInitVec<size_t> mappings(protoPalettes.size());
	for (size_t i = 0; i < assignments.size(); ++i) {
		for (ProtoPalAttrs const &attrs : assignments[i]) {
			mappings[attrs.protoPalIndex] = i;
		}
	}
	return {mappings, assignments.size()};
}